

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxLvlPrev(Fts5DlidxLvl *pLvl)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int ii;
  int nZero;
  u8 *a;
  int iOff;
  u64 delta;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  u64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RDI + 1);
  if (*(int *)(in_RDI + 2) < iVar1) {
    lVar2 = *(long *)*in_RDI;
    *(undefined4 *)(in_RDI + 1) = 0;
    fts5DlidxLvlNext((Fts5DlidxLvl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    while( true ) {
      iVar5 = 0;
      iVar4 = *(int *)(in_RDI + 1);
      local_10 = 0;
      for (; *(char *)(lVar2 + iVar4) == '\0'; iVar4 = iVar4 + 1) {
        iVar5 = iVar5 + 1;
      }
      bVar3 = sqlite3Fts5GetVarint((uchar *)(lVar2 + iVar4),&local_10);
      if (iVar1 <= (int)((uint)bVar3 + iVar4)) break;
      *(int *)((long)in_RDI + 0x14) = iVar5 + 1 + *(int *)((long)in_RDI + 0x14);
      in_RDI[3] = local_10 + in_RDI[3];
      *(uint *)(in_RDI + 1) = (uint)bVar3 + iVar4;
    }
  }
  else {
    *(undefined4 *)((long)in_RDI + 0xc) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(int *)((long)in_RDI + 0xc);
}

Assistant:

static int fts5DlidxLvlPrev(Fts5DlidxLvl *pLvl){
  int iOff = pLvl->iOff;

  assert( pLvl->bEof==0 );
  if( iOff<=pLvl->iFirstOff ){
    pLvl->bEof = 1;
  }else{
    u8 *a = pLvl->pData->p;

    pLvl->iOff = 0;
    fts5DlidxLvlNext(pLvl);
    while( 1 ){
      int nZero = 0;
      int ii = pLvl->iOff;
      u64 delta = 0;

      while( a[ii]==0 ){
        nZero++;
        ii++;
      }
      ii += sqlite3Fts5GetVarint(&a[ii], &delta);

      if( ii>=iOff ) break;
      pLvl->iLeafPgno += nZero+1;
      pLvl->iRowid += delta;
      pLvl->iOff = ii;
    }
  }

  return pLvl->bEof;
}